

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

void __thiscall Assembler::printSymbolTable(Assembler *this)

{
  long lVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  char *pcVar4;
  ofstream file;
  undefined8 uStack_220;
  uint auStack_218 [122];
  
  std::ofstream::ofstream((ostream *)&file,(string *)&this->outputFileName,_S_out);
  poVar2 = std::operator<<((ostream *)&file,"Symbol table:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&file,"Value\tType\tSection\t\tName\t\tId\t\tSize");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (p_Var3 = (this->symbolTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      lVar1 = *(long *)(_file + -0x18),
      (_Rb_tree_header *)p_Var3 != &(this->symbolTable)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    *(uint *)((long)auStack_218 + lVar1) = *(uint *)((long)auStack_218 + lVar1) & 0xffffffb5 | 2;
    poVar2 = std::operator<<((ostream *)&file,0x30);
    *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 8;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)&p_Var3[3].field_0x4);
    std::operator<<(poVar2,"\t");
    pcVar4 = "g\t";
    if (*(char *)&p_Var3[3]._M_parent == '\0') {
      pcVar4 = "l\t";
    }
    std::operator<<((ostream *)&file,pcVar4);
    *(uint *)((long)auStack_218 + *(long *)(_file + -0x18)) =
         *(uint *)((long)auStack_218 + *(long *)(_file + -0x18)) & 0xffffffb5 | 2;
    *(undefined8 *)((long)&uStack_220 + *(long *)(_file + -0x18)) = 8;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&file,p_Var3[3]._M_color);
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<(poVar2,0x20);
    *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 8;
    poVar2 = std::operator<<(poVar2,(string *)(p_Var3 + 2));
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = std::operator<<(poVar2,0x30);
    *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 8;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)*(ushort *)&p_Var3[3]._M_left);
    std::operator<<(poVar2,"\t");
    *(uint *)((long)auStack_218 + *(long *)(_file + -0x18)) =
         *(uint *)((long)auStack_218 + *(long *)(_file + -0x18)) & 0xffffffb5 | 2;
    *(undefined8 *)((long)&uStack_220 + *(long *)(_file + -0x18)) = 8;
    poVar2 = std::operator<<((ostream *)&file,0x30);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)((long)&p_Var3[3]._M_parent + 4));
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  *(uint *)((long)auStack_218 + lVar1) = *(uint *)((long)auStack_218 + lVar1) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>((ostream *)&file);
  std::ofstream::~ofstream(&file);
  return;
}

Assistant:

void Assembler::printSymbolTable() {
    ofstream file(this->outputFileName);

    file << "Symbol table:" << endl;
    file << "Value\tType\tSection\t\tName\t\tId\t\tSize" << endl;
    for (auto &entry: symbolTable) {
        file << dec << setfill('0') << setw(8) << entry.second.value << "\t";
        //file << hex << setfill('0') << setw(8) << (0xffff & entry.second.value) << "\t";

        if (entry.second.isGlobal == false)
            file << "l\t";
        else {
            file << "g\t";
        }
        file << dec << setw(8) << entry.second.section << "\t" << setfill(' ') << setw(8) << entry.second.symbolName
             << "\t"
             << setfill('0')
             << setw(8) << (0xffff & entry.second.id) << "\t";
        file << dec << setw(8) << setfill('0') << entry.second.size << endl;
    }
    file << dec << endl;


}